

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<Fad<float>_>::Subst_Diag(TPZMatrix<Fad<float>_> *this,TPZFMatrix<Fad<float>_> *B)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  float *pfVar6;
  float *pfVar7;
  long lVar8;
  ulong uVar9;
  float *pfVar10;
  float *pfVar11;
  long lVar12;
  Fad<float> pivot;
  Fad<float> local_a8;
  TPZMatrix<Fad<float>_> *local_88;
  TPZFMatrix<Fad<float>_> *local_80;
  long local_78;
  Fad<float> local_70;
  Fad<float> local_50;
  
  lVar8 = (B->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
  iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if (lVar8 != CONCAT44(extraout_var,iVar5)) {
    Error("TPZMatrix::Subst_Diag incompatible dimensions\n",(char *)0x0);
  }
  iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar5) != 0 && -1 < extraout_var_00) {
    lVar8 = 0;
    local_88 = this;
    local_80 = B;
    do {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_50,this,lVar8,lVar8);
      if (0 < (B->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol) {
        lVar12 = 0;
        local_78 = lVar8;
        do {
          (*(B->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(&local_70,B,lVar8,lVar12);
          iVar4 = local_50.dx_.num_elts;
          fVar3 = local_50.val_;
          iVar5 = local_70.dx_.num_elts;
          fVar2 = local_70.val_;
          local_a8.val_ = local_70.val_ / local_50.val_;
          uVar1 = local_50.dx_.num_elts;
          if (local_50.dx_.num_elts < local_70.dx_.num_elts) {
            uVar1 = local_70.dx_.num_elts;
          }
          local_a8.dx_.num_elts = 0;
          local_a8.dx_.ptr_to_data = (float *)0x0;
          if (0 < (int)uVar1) {
            local_a8.dx_.num_elts = uVar1;
            local_a8.dx_.ptr_to_data = (float *)operator_new__((ulong)uVar1 * 4);
            uVar9 = 0;
            pfVar6 = local_70.dx_.ptr_to_data;
            pfVar7 = local_50.dx_.ptr_to_data;
            do {
              pfVar10 = pfVar6;
              if (iVar5 == 0) {
                pfVar10 = &local_70.defaultVal;
              }
              pfVar11 = pfVar7;
              if (iVar4 == 0) {
                pfVar11 = &local_50.defaultVal;
              }
              local_a8.dx_.ptr_to_data[uVar9] =
                   (*pfVar10 * fVar3 - *pfVar11 * fVar2) / (fVar3 * fVar3);
              uVar9 = uVar9 + 1;
              pfVar7 = pfVar7 + 1;
              pfVar6 = pfVar6 + 1;
            } while (uVar1 != uVar9);
          }
          lVar8 = local_78;
          B = local_80;
          local_a8.defaultVal = 0.0;
          (*(local_80->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(local_80,local_78,lVar12,&local_a8);
          Fad<float>::~Fad(&local_a8);
          Fad<float>::~Fad(&local_70);
          lVar12 = lVar12 + 1;
        } while (lVar12 < (B->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol);
      }
      Fad<float>::~Fad(&local_50);
      this = local_88;
      lVar8 = lVar8 + 1;
      iVar5 = (*(local_88->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(local_88);
    } while (lVar8 < CONCAT44(extraout_var_01,iVar5));
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != Dim())) {
        Error("TPZMatrix::Subst_Diag incompatible dimensions\n");
	}
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			B->PutVal( r, c, B->GetVal( r, c ) / pivot );
		}
	}
	return( 1 );
}